

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImgDisplay * __thiscall
cimg_library::CImgDisplay::set_key(CImgDisplay *this,uint keycode,bool pressed)

{
  bool bVar1;
  byte in_DL;
  uint in_ESI;
  CImgDisplay *in_RDI;
  
  bVar1 = (bool)(in_DL & 1);
  if (in_ESI == 0xff1b) {
    in_RDI->_is_keyESC = bVar1;
  }
  if (in_ESI == 0xffbe) {
    in_RDI->_is_keyF1 = bVar1;
  }
  if (in_ESI == 0xffbf) {
    in_RDI->_is_keyF2 = bVar1;
  }
  if (in_ESI == 0xffc0) {
    in_RDI->_is_keyF3 = bVar1;
  }
  if (in_ESI == 0xffc1) {
    in_RDI->_is_keyF4 = bVar1;
  }
  if (in_ESI == 0xffc2) {
    in_RDI->_is_keyF5 = bVar1;
  }
  if (in_ESI == 0xffc3) {
    in_RDI->_is_keyF6 = bVar1;
  }
  if (in_ESI == 0xffc4) {
    in_RDI->_is_keyF7 = bVar1;
  }
  if (in_ESI == 0xffc5) {
    in_RDI->_is_keyF8 = bVar1;
  }
  if (in_ESI == 0xffc6) {
    in_RDI->_is_keyF9 = bVar1;
  }
  if (in_ESI == 0xffc7) {
    in_RDI->_is_keyF10 = bVar1;
  }
  if (in_ESI == 0xffc8) {
    in_RDI->_is_keyF11 = bVar1;
  }
  if (in_ESI == 0xffc9) {
    in_RDI->_is_keyF12 = bVar1;
  }
  if (in_ESI == 0xff13) {
    in_RDI->_is_keyPAUSE = bVar1;
  }
  if (in_ESI == 0x31) {
    in_RDI->_is_key1 = bVar1;
  }
  if (in_ESI == 0x32) {
    in_RDI->_is_key2 = bVar1;
  }
  if (in_ESI == 0x33) {
    in_RDI->_is_key3 = bVar1;
  }
  if (in_ESI == 0x34) {
    in_RDI->_is_key4 = bVar1;
  }
  if (in_ESI == 0x35) {
    in_RDI->_is_key5 = bVar1;
  }
  if (in_ESI == 0x36) {
    in_RDI->_is_key6 = bVar1;
  }
  if (in_ESI == 0x37) {
    in_RDI->_is_key7 = bVar1;
  }
  if (in_ESI == 0x38) {
    in_RDI->_is_key8 = bVar1;
  }
  if (in_ESI == 0x39) {
    in_RDI->_is_key9 = bVar1;
  }
  if (in_ESI == 0x30) {
    in_RDI->_is_key0 = bVar1;
  }
  if (in_ESI == 0xff08) {
    in_RDI->_is_keyBACKSPACE = bVar1;
  }
  if (in_ESI == 0xff63) {
    in_RDI->_is_keyINSERT = bVar1;
  }
  if (in_ESI == 0xff50) {
    in_RDI->_is_keyHOME = bVar1;
  }
  if (in_ESI == 0xff55) {
    in_RDI->_is_keyPAGEUP = bVar1;
  }
  if (in_ESI == 0xff09) {
    in_RDI->_is_keyTAB = bVar1;
  }
  if (in_ESI == 0x71) {
    in_RDI->_is_keyQ = bVar1;
  }
  if (in_ESI == 0x77) {
    in_RDI->_is_keyW = bVar1;
  }
  if (in_ESI == 0x65) {
    in_RDI->_is_keyE = bVar1;
  }
  if (in_ESI == 0x72) {
    in_RDI->_is_keyR = bVar1;
  }
  if (in_ESI == 0x74) {
    in_RDI->_is_keyT = bVar1;
  }
  if (in_ESI == 0x79) {
    in_RDI->_is_keyY = bVar1;
  }
  if (in_ESI == 0x75) {
    in_RDI->_is_keyU = bVar1;
  }
  if (in_ESI == 0x69) {
    in_RDI->_is_keyI = bVar1;
  }
  if (in_ESI == 0x6f) {
    in_RDI->_is_keyO = bVar1;
  }
  if (in_ESI == 0x70) {
    in_RDI->_is_keyP = bVar1;
  }
  if (in_ESI == 0xffff) {
    in_RDI->_is_keyDELETE = bVar1;
  }
  if (in_ESI == 0xff57) {
    in_RDI->_is_keyEND = bVar1;
  }
  if (in_ESI == 0xff56) {
    in_RDI->_is_keyPAGEDOWN = bVar1;
  }
  if (in_ESI == 0xffe5) {
    in_RDI->_is_keyCAPSLOCK = bVar1;
  }
  if (in_ESI == 0x61) {
    in_RDI->_is_keyA = bVar1;
  }
  if (in_ESI == 0x73) {
    in_RDI->_is_keyS = bVar1;
  }
  if (in_ESI == 100) {
    in_RDI->_is_keyD = bVar1;
  }
  if (in_ESI == 0x66) {
    in_RDI->_is_keyF = bVar1;
  }
  if (in_ESI == 0x67) {
    in_RDI->_is_keyG = bVar1;
  }
  if (in_ESI == 0x68) {
    in_RDI->_is_keyH = bVar1;
  }
  if (in_ESI == 0x6a) {
    in_RDI->_is_keyJ = bVar1;
  }
  if (in_ESI == 0x6b) {
    in_RDI->_is_keyK = bVar1;
  }
  if (in_ESI == 0x6c) {
    in_RDI->_is_keyL = bVar1;
  }
  if (in_ESI == 0xff0d) {
    in_RDI->_is_keyENTER = bVar1;
  }
  if (in_ESI == 0xffe1) {
    in_RDI->_is_keySHIFTLEFT = bVar1;
  }
  if (in_ESI == 0x7a) {
    in_RDI->_is_keyZ = bVar1;
  }
  if (in_ESI == 0x78) {
    in_RDI->_is_keyX = bVar1;
  }
  if (in_ESI == 99) {
    in_RDI->_is_keyC = bVar1;
  }
  if (in_ESI == 0x76) {
    in_RDI->_is_keyV = bVar1;
  }
  if (in_ESI == 0x62) {
    in_RDI->_is_keyB = bVar1;
  }
  if (in_ESI == 0x6e) {
    in_RDI->_is_keyN = bVar1;
  }
  if (in_ESI == 0x6d) {
    in_RDI->_is_keyM = bVar1;
  }
  if (in_ESI == 0xffe2) {
    in_RDI->_is_keySHIFTRIGHT = bVar1;
  }
  if (in_ESI == 0xff52) {
    in_RDI->_is_keyARROWUP = bVar1;
  }
  if (in_ESI == 0xffe3) {
    in_RDI->_is_keyCTRLLEFT = bVar1;
  }
  if (in_ESI == 0xffeb) {
    in_RDI->_is_keyAPPLEFT = bVar1;
  }
  if (in_ESI == 0xffe9) {
    in_RDI->_is_keyALT = bVar1;
  }
  if (in_ESI == 0x20) {
    in_RDI->_is_keySPACE = bVar1;
  }
  if (in_ESI == 0xffea) {
    in_RDI->_is_keyALTGR = bVar1;
  }
  if (in_ESI == 0xffec) {
    in_RDI->_is_keyAPPRIGHT = bVar1;
  }
  if (in_ESI == 0xff67) {
    in_RDI->_is_keyMENU = bVar1;
  }
  if (in_ESI == 0xffe4) {
    in_RDI->_is_keyCTRLRIGHT = bVar1;
  }
  if (in_ESI == 0xff51) {
    in_RDI->_is_keyARROWLEFT = bVar1;
  }
  if (in_ESI == 0xff54) {
    in_RDI->_is_keyARROWDOWN = bVar1;
  }
  if (in_ESI == 0xff53) {
    in_RDI->_is_keyARROWRIGHT = bVar1;
  }
  if (in_ESI == 0xffb0) {
    in_RDI->_is_keyPAD0 = bVar1;
  }
  if (in_ESI == 0xffb1) {
    in_RDI->_is_keyPAD1 = bVar1;
  }
  if (in_ESI == 0xffb2) {
    in_RDI->_is_keyPAD2 = bVar1;
  }
  if (in_ESI == 0xffb3) {
    in_RDI->_is_keyPAD3 = bVar1;
  }
  if (in_ESI == 0xffb4) {
    in_RDI->_is_keyPAD4 = bVar1;
  }
  if (in_ESI == 0xffb5) {
    in_RDI->_is_keyPAD5 = bVar1;
  }
  if (in_ESI == 0xffb6) {
    in_RDI->_is_keyPAD6 = bVar1;
  }
  if (in_ESI == 0xffb7) {
    in_RDI->_is_keyPAD7 = bVar1;
  }
  if (in_ESI == 0xffb8) {
    in_RDI->_is_keyPAD8 = bVar1;
  }
  if (in_ESI == 0xffb9) {
    in_RDI->_is_keyPAD9 = bVar1;
  }
  if (in_ESI == 0xffab) {
    in_RDI->_is_keyPADADD = bVar1;
  }
  if (in_ESI == 0xffad) {
    in_RDI->_is_keyPADSUB = bVar1;
  }
  if (in_ESI == 0xffaa) {
    in_RDI->_is_keyPADMUL = bVar1;
  }
  if (in_ESI == 0xffaf) {
    in_RDI->_is_keyPADDIV = bVar1;
  }
  if (bVar1 == false) {
    if (in_RDI->_keys[0] != 0) {
      memmove(in_RDI->_keys + 1,in_RDI->_keys,0x1fc);
      in_RDI->_keys[0] = 0;
    }
    if (in_RDI->_released_keys[0] != 0) {
      memmove(in_RDI->_released_keys + 1,in_RDI->_released_keys,0x1fc);
    }
    in_RDI->_released_keys[0] = in_ESI;
  }
  else {
    if (in_RDI->_keys[0] != 0) {
      memmove(in_RDI->_keys + 1,in_RDI->_keys,0x1fc);
    }
    in_RDI->_keys[0] = in_ESI;
    if (in_RDI->_released_keys[0] != 0) {
      memmove(in_RDI->_released_keys + 1,in_RDI->_released_keys,0x1fc);
      in_RDI->_released_keys[0] = 0;
    }
  }
  in_RDI->_is_event = (bool)(-(in_ESI != 0) & 1);
  return in_RDI;
}

Assistant:

CImgDisplay& set_key(const unsigned int keycode, const bool pressed=true) {
#define _cimg_set_key(k) if (keycode==cimg::key##k) _is_key##k = pressed;
      _cimg_set_key(ESC); _cimg_set_key(F1); _cimg_set_key(F2); _cimg_set_key(F3);
      _cimg_set_key(F4); _cimg_set_key(F5); _cimg_set_key(F6); _cimg_set_key(F7);
      _cimg_set_key(F8); _cimg_set_key(F9); _cimg_set_key(F10); _cimg_set_key(F11);
      _cimg_set_key(F12); _cimg_set_key(PAUSE); _cimg_set_key(1); _cimg_set_key(2);
      _cimg_set_key(3); _cimg_set_key(4); _cimg_set_key(5); _cimg_set_key(6);
      _cimg_set_key(7); _cimg_set_key(8); _cimg_set_key(9); _cimg_set_key(0);
      _cimg_set_key(BACKSPACE); _cimg_set_key(INSERT); _cimg_set_key(HOME);
      _cimg_set_key(PAGEUP); _cimg_set_key(TAB); _cimg_set_key(Q); _cimg_set_key(W);
      _cimg_set_key(E); _cimg_set_key(R); _cimg_set_key(T); _cimg_set_key(Y);
      _cimg_set_key(U); _cimg_set_key(I); _cimg_set_key(O); _cimg_set_key(P);
      _cimg_set_key(DELETE); _cimg_set_key(END); _cimg_set_key(PAGEDOWN);
      _cimg_set_key(CAPSLOCK); _cimg_set_key(A); _cimg_set_key(S); _cimg_set_key(D);
      _cimg_set_key(F); _cimg_set_key(G); _cimg_set_key(H); _cimg_set_key(J);
      _cimg_set_key(K); _cimg_set_key(L); _cimg_set_key(ENTER);
      _cimg_set_key(SHIFTLEFT); _cimg_set_key(Z); _cimg_set_key(X); _cimg_set_key(C);
      _cimg_set_key(V); _cimg_set_key(B); _cimg_set_key(N); _cimg_set_key(M);
      _cimg_set_key(SHIFTRIGHT); _cimg_set_key(ARROWUP); _cimg_set_key(CTRLLEFT);
      _cimg_set_key(APPLEFT); _cimg_set_key(ALT); _cimg_set_key(SPACE); _cimg_set_key(ALTGR);
      _cimg_set_key(APPRIGHT); _cimg_set_key(MENU); _cimg_set_key(CTRLRIGHT);
      _cimg_set_key(ARROWLEFT); _cimg_set_key(ARROWDOWN); _cimg_set_key(ARROWRIGHT);
      _cimg_set_key(PAD0); _cimg_set_key(PAD1); _cimg_set_key(PAD2);
      _cimg_set_key(PAD3); _cimg_set_key(PAD4); _cimg_set_key(PAD5);
      _cimg_set_key(PAD6); _cimg_set_key(PAD7); _cimg_set_key(PAD8);
      _cimg_set_key(PAD9); _cimg_set_key(PADADD); _cimg_set_key(PADSUB);
      _cimg_set_key(PADMUL); _cimg_set_key(PADDIV);
      if (pressed) {
        if (*_keys)
          std::memmove((void*)(_keys+1),(void*)_keys,sizeof(_keys) - sizeof(unsigned int));
        *_keys = keycode;
        if (*_released_keys) {
          std::memmove((void*)(_released_keys+1),(void*)_released_keys,sizeof(_released_keys) - sizeof(unsigned int));
          *_released_keys = 0;
        }
      } else {
        if (*_keys) {
          std::memmove((void*)(_keys+1),(void*)_keys,sizeof(_keys) - sizeof(unsigned int));
          *_keys = 0;
        }
        if (*_released_keys)
          std::memmove((void*)(_released_keys+1),(void*)_released_keys,sizeof(_released_keys) - sizeof(unsigned int));
        *_released_keys = keycode;
      }
      _is_event = keycode?true:false;
      return *this;
    }